

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  int *piVar1;
  ostream *poVar2;
  Point2f PVar3;
  int iVar4;
  int *piVar5;
  ulong uVar6;
  int in_R8D;
  pointer puVar7;
  size_t result;
  long lVar8;
  unsigned_long uVar9;
  vector<unsigned_long,_std::allocator<unsigned_long>_> arrow_point;
  arrows_position arrows_found;
  Mat image_test;
  Mat image_test_gray;
  array<cv::RotatedRect,_10UL> target_ellipses;
  array<cv::Mat,_10UL> target_ring_mask;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_980;
  int *local_968;
  int *piStack_960;
  long local_958;
  void *pvStack_950;
  long local_948;
  long lStack_940;
  Mat local_938 [8];
  int local_930;
  int local_92c;
  long local_928;
  Mat local_8d8 [96];
  array<cv::RotatedRect,_10UL> local_878;
  undefined1 local_7b0 [16];
  long local_7a0;
  undefined1 local_3f0 [16];
  Size SStack_3e0;
  
  local_7b0._0_8_ = &local_7a0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_7b0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Surrog[P]ArcheryCounter/Images/\\20190325_204137.jpg"
             ,"");
  cv::imread((string *)local_938,(int)local_7b0);
  if ((long *)local_7b0._0_8_ != &local_7a0) {
    operator_delete((void *)local_7b0._0_8_,local_7a0 + 1);
  }
  if (local_928 == 0) {
    puts("No image data");
    iVar4 = -1;
  }
  else {
    cv::Mat::Mat(local_8d8);
    local_7a0 = 0;
    local_7b0._0_4_ = 2.3693558e-38;
    SStack_3e0.width = 0;
    SStack_3e0.height = 0;
    local_3f0._0_4_ = 0x2010000;
    local_7b0._8_8_ = local_938;
    local_3f0._8_8_ = local_8d8;
    cv::cvtColor((cv *)local_7b0,(_InputArray *)local_3f0,(_OutputArray *)0x6,0,in_R8D);
    ellipses::find_target(&local_878,local_938,false);
    compute_target_ring_mask((array<cv::Mat,_10UL> *)local_3f0,&local_878,local_930,local_92c,false)
    ;
    local_948 = 0;
    lStack_940 = 0;
    local_958 = 0;
    pvStack_950 = (void *)0x0;
    local_968 = (int *)0x0;
    piStack_960 = (int *)0x0;
    ellipses::display_ellipses<cv::RotatedRect*>
              (local_938,local_878._M_elems,(RotatedRect *)local_7b0);
    if ((long)piStack_960 - (long)local_968 != local_948 - (long)pvStack_950) {
      __assert_fail("arrows_found.tip.size() == arrows_found.fletching.size()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Surrog[P]ArcheryCounter/main.cpp"
                    ,0x53,"int main(int, char **)");
    }
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              (&local_980,(long)piStack_960 - (long)local_968 >> 3,(allocator_type *)local_7b0);
    piVar1 = piStack_960;
    puVar7 = local_980.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    for (piVar5 = local_968; piVar5 != piVar1; piVar5 = piVar5 + 2) {
      lVar8 = 0;
      do {
        cv::Mat::Mat((Mat *)(local_7b0 + lVar8),(Mat *)(local_3f0 + lVar8));
        lVar8 = lVar8 + 0x60;
      } while (lVar8 != 0x3c0);
      uVar9 = 10;
      PVar3 = (Point2f)&local_7a0;
      do {
        if (*(char *)((long)*piVar5 +
                     **(long **)((long)PVar3 + 0x38) * (long)piVar5[1] + *(long *)PVar3) != '\0')
        goto LAB_0010dea7;
        PVar3 = (Point2f)((long)PVar3 + 0x60);
        uVar9 = uVar9 - 1;
      } while (uVar9 != 0);
      uVar9 = 0;
LAB_0010dea7:
      lVar8 = 0x360;
      do {
        cv::Mat::~Mat((Mat *)(local_7b0 + lVar8));
        lVar8 = lVar8 + -0x60;
      } while (lVar8 != -0x60);
      *puVar7 = uVar9;
      puVar7 = puVar7 + 1;
    }
    if (local_980.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        local_980.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start) {
      uVar6 = 0;
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"arrow ",6);
        poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
        local_7b0[0] = 10;
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,local_7b0,1);
        uVar6 = uVar6 + 1;
      } while (uVar6 < (ulong)((long)local_980.
                                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_980.
                                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 3));
    }
    if (local_980.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_980.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_980.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_980.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (pvStack_950 != (void *)0x0) {
      operator_delete(pvStack_950,lStack_940 - (long)pvStack_950);
    }
    if (local_968 != (int *)0x0) {
      operator_delete(local_968,local_958 - (long)local_968);
    }
    lVar8 = 0x360;
    do {
      cv::Mat::~Mat((Mat *)(local_3f0 + lVar8));
      lVar8 = lVar8 + -0x60;
    } while (lVar8 != -0x60);
    cv::Mat::~Mat(local_8d8);
    iVar4 = 0;
  }
  cv::Mat::~Mat(local_938);
  return iVar4;
}

Assistant:

int main(int argc, char** argv)
{
    cv::Mat image_test = cv::imread(test, cv::IMREAD_COLOR);

    if(!image_test.data)
    {
        printf("No image data\n");
        return -1;
    }

    cv::Mat image_test_gray;
    cv::cvtColor(image_test, image_test_gray, cv::COLOR_BGR2GRAY);

    std::array<cv::RotatedRect, 10> target_ellipses = ellipses::find_target(image_test, false);

    std::array<cv::Mat, 10> target_ring_mask
        = compute_target_ring_mask(target_ellipses, image_test.rows, image_test.cols);

    auto arrows_found = NN::find_arrows(image_test, image_test_gray, target_ring_mask);

    ellipses::display_ellipses(image_test, target_ellipses.begin(), target_ellipses.end());

    assert(arrows_found.tip.size() == arrows_found.fletching.size());

    std::vector<std::size_t> arrow_point(arrows_found.tip.size());
    std::transform(arrows_found.tip.begin(), arrows_found.tip.end(), arrow_point.begin(),
        [&target_ring_mask](const cv::Point& tip_pos) { return get_arrow_point(tip_pos, target_ring_mask); });

	for(std::size_t i = 0; i < arrow_point.size();                                                                       i++)
    {
        std::cout << "arrow " << i << arrow_point[i] << '\n';
    }

    return 0;
}